

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O0

void phasor_setup(void)

{
  _class *p_Var1;
  t_symbol *ptVar2;
  
  ptVar2 = gensym("phasor~");
  phasor_class = class_new(ptVar2,phasor_new,(t_method)0x0,0x40,0,A_DEFFLOAT,0);
  class_domainsignalin(phasor_class,0x3c);
  p_Var1 = phasor_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,phasor_dsp,ptVar2,A_CANT,0);
  p_Var1 = phasor_class;
  ptVar2 = gensym("ft1");
  class_addmethod(p_Var1,phasor_ft1,ptVar2,A_FLOAT,0);
  return;
}

Assistant:

static void phasor_setup(void)
{
    phasor_class = class_new(gensym("phasor~"), (t_newmethod)phasor_new, 0,
        sizeof(t_phasor), 0, A_DEFFLOAT, 0);
    CLASS_MAINSIGNALIN(phasor_class, t_phasor, x_f);
    class_addmethod(phasor_class, (t_method)phasor_dsp,
        gensym("dsp"), A_CANT, 0);
    class_addmethod(phasor_class, (t_method)phasor_ft1,
        gensym("ft1"), A_FLOAT, 0);
}